

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSort.c
# Opt level: O3

void Gia_SortTest(void)

{
  int iVar1;
  int *piVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  int *piVar6;
  timespec ts;
  timespec local_20;
  
  clock_gettime(3,&local_20);
  printf("Sorting %d integers\n",100000000);
  piVar2 = Gia_SortGetTest(100000000);
  iVar1 = clock_gettime(3,&local_20);
  if (iVar1 < 0) {
    lVar3 = 1;
  }
  else {
    lVar3 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_20.tv_nsec),8);
    lVar3 = ((lVar3 >> 7) - (lVar3 >> 0x3f)) + local_20.tv_sec * -1000000;
  }
  piVar6 = piVar2;
  qsort(piVar2,100000000,4,num_cmp1);
  Abc_Print((int)piVar6,"%s =","qsort  ");
  iVar5 = 3;
  iVar1 = clock_gettime(3,&local_20);
  if (iVar1 < 0) {
    lVar4 = -1;
  }
  else {
    lVar4 = local_20.tv_nsec / 1000 + local_20.tv_sec * 1000000;
  }
  Abc_Print(iVar5,"%9.2f sec\n",(double)(lVar4 + lVar3) / 1000000.0);
  lVar3 = 1;
  do {
    if (piVar2[lVar3] < piVar2[lVar3 + -1]) goto LAB_00720a4f;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 100000000);
  free(piVar2);
  piVar2 = Gia_SortGetTest(100000000);
  iVar1 = clock_gettime(3,&local_20);
  if (iVar1 < 0) {
    lVar3 = 1;
  }
  else {
    lVar3 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_20.tv_nsec),8);
    lVar3 = ((lVar3 >> 7) - (lVar3 >> 0x3f)) + local_20.tv_sec * -1000000;
  }
  piVar6 = piVar2;
  sort_rec(piVar2,100000000,num_cmp2);
  Abc_Print((int)piVar6,"%s =","minisat");
  iVar5 = 3;
  iVar1 = clock_gettime(3,&local_20);
  if (iVar1 < 0) {
    lVar4 = -1;
  }
  else {
    lVar4 = local_20.tv_nsec / 1000 + local_20.tv_sec * 1000000;
  }
  Abc_Print(iVar5,"%9.2f sec\n",(double)(lVar4 + lVar3) / 1000000.0);
  lVar3 = 1;
  do {
    if (piVar2[lVar3] < piVar2[lVar3 + -1]) goto LAB_00720a4f;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 100000000);
  free(piVar2);
  piVar2 = Gia_SortGetTest(100000000);
  iVar1 = clock_gettime(3,&local_20);
  if (iVar1 < 0) {
    lVar3 = 1;
  }
  else {
    lVar3 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_20.tv_nsec),8);
    lVar3 = ((lVar3 >> 7) - (lVar3 >> 0x3f)) + local_20.tv_sec * -1000000;
  }
  piVar6 = piVar2;
  sort_rec2(piVar2,100000000);
  Abc_Print((int)piVar6,"%s =","minisat with inlined comparison");
  iVar5 = 3;
  iVar1 = clock_gettime(3,&local_20);
  if (iVar1 < 0) {
    lVar4 = -1;
  }
  else {
    lVar4 = local_20.tv_nsec / 1000 + local_20.tv_sec * 1000000;
  }
  Abc_Print(iVar5,"%9.2f sec\n",(double)(lVar4 + lVar3) / 1000000.0);
  lVar3 = 1;
  while (piVar2[lVar3 + -1] <= piVar2[lVar3]) {
    lVar3 = lVar3 + 1;
    if (lVar3 == 100000000) {
      free(piVar2);
      return;
    }
  }
LAB_00720a4f:
  __assert_fail("pArray[i-1] <= pArray[i]",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaSort.c"
                ,0x9d,"void Gia_SortVerifySorted(int *, int)");
}

Assistant:

void Gia_SortTest()
{
    int nSize = 100000000;
    int * pArray;
    abctime clk = Abc_Clock();

    printf( "Sorting %d integers\n", nSize );
    pArray = Gia_SortGetTest( nSize );
clk = Abc_Clock();
    qsort( pArray, nSize, 4, (int (*)(const void *, const void *)) num_cmp1 );
ABC_PRT( "qsort  ", Abc_Clock() - clk );
    Gia_SortVerifySorted( pArray, nSize );
    ABC_FREE( pArray );

    pArray = Gia_SortGetTest( nSize );
clk = Abc_Clock();
    minisat_sort( pArray, nSize, (int (*)(const void *, const void *)) num_cmp2 );
ABC_PRT( "minisat", Abc_Clock() - clk );
    Gia_SortVerifySorted( pArray, nSize );
    ABC_FREE( pArray );

    pArray = Gia_SortGetTest( nSize );
clk = Abc_Clock();
    minisat_sort2( pArray, nSize );
ABC_PRT( "minisat with inlined comparison", Abc_Clock() - clk );
    Gia_SortVerifySorted( pArray, nSize );
    ABC_FREE( pArray );
}